

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

int AF_AActor_TraceBleedAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *target;
  bool bVar5;
  DAngle local_30;
  DAngle local_28;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_004174a5;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    target = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (target != (AActor *)0x0) {
        pPVar3 = (target->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(target->super_DThinker).super_DObject._vptr_DObject)(target);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (target->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004174a5;
        }
        goto LAB_00417428;
      }
    }
    else if (target != (AActor *)0x0) goto LAB_00417495;
    target = (AActor *)0x0;
LAB_00417428:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if (numparam < 3) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar4 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                local_28.Degrees = (double)param[2].field_0.field_1.a;
                local_30.Degrees = (double)param[3].field_0.field_1.a;
                P_TraceBleed(param[1].field_0.i,target,&local_28,&local_30);
                return 0;
              }
              pcVar4 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                          ,0x1279,
                          "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar4 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0x1278,
                      "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar4 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1277,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_00417495:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004174a5:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x1276,
                "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TraceBleedAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(damage);
	PARAM_FLOAT(angle);
	PARAM_FLOAT(pitch);

	P_TraceBleed(damage, self, angle, pitch);
	return 0;
}